

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O1

int trex_charnode(TRex *exp,TRexBool isclass)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  ushort **ppuVar4;
  int iVar5;
  
  pcVar2 = exp->_p;
  cVar1 = *pcVar2;
  if ((long)cVar1 == 0x5c) {
    exp->_p = pcVar2 + 1;
    iVar5 = (int)pcVar2[1];
    switch(pcVar2[1]) {
    case 'A':
    case 'C':
    case 'D':
    case 'P':
    case 'S':
    case 'W':
    case 'X':
    case 'a':
    case 'c':
    case 'd':
    case 'l':
    case 'p':
    case 's':
    case 'u':
    case 'w':
    case 'x':
      exp->_p = pcVar2 + 2;
      iVar3 = trex_newnode(exp,0x106);
      exp->_nodes[iVar3].left = iVar5;
      return iVar3;
    case 'B':
    case 'b':
      if (isclass == 0) {
        iVar5 = trex_newnode(exp,0x10c);
        pcVar2 = exp->_p;
        exp->_nodes[iVar5].left = (int)*pcVar2;
        exp->_p = pcVar2 + 1;
        return iVar5;
      }
    default:
      exp->_p = pcVar2 + 2;
      break;
    case 'f':
      exp->_p = pcVar2 + 2;
      iVar5 = 0xc;
      break;
    case 'n':
      exp->_p = pcVar2 + 2;
      iVar5 = 10;
      break;
    case 'r':
      exp->_p = pcVar2 + 2;
      iVar5 = 0xd;
      break;
    case 't':
      exp->_p = pcVar2 + 2;
      iVar5 = 9;
      break;
    case 'v':
      exp->_p = pcVar2 + 2;
      iVar5 = 0xb;
    }
  }
  else {
    ppuVar4 = __ctype_b_loc();
    if ((*(byte *)((long)*ppuVar4 + (long)cVar1 * 2 + 1) & 0x40) == 0) {
      if (exp->_error != (char **)0x0) {
        *exp->_error = "letter expected";
      }
      longjmp((__jmp_buf_tag *)exp->_jmpbuf,-1);
    }
    exp->_p = pcVar2 + 1;
    iVar5 = (int)cVar1;
  }
  iVar5 = trex_newnode(exp,iVar5);
  return iVar5;
}

Assistant:

static int trex_charnode(TRex * exp, TRexBool isclass) {
	TRexChar t;

	if (*exp->_p == TREX_SYMBOL_ESCAPE_CHAR) {
		exp->_p++;

		switch (*exp->_p) {
			case 'n':
				exp->_p++;
				return trex_newnode(exp, '\n');

			case 't':
				exp->_p++;
				return trex_newnode(exp, '\t');

			case 'r':
				exp->_p++;
				return trex_newnode(exp, '\r');

			case 'f':
				exp->_p++;
				return trex_newnode(exp, '\f');

			case 'v':
				exp->_p++;
				return trex_newnode(exp, '\v');

			case 'a':
			case 'A':
			case 'w':
			case 'W':
			case 's':
			case 'S':
			case 'd':
			case 'D':
			case 'x':
			case 'X':
			case 'c':
			case 'C':
			case 'p':
			case 'P':
			case 'l':
			case 'u': {
				t = *exp->_p;
				exp->_p++;
				return trex_charclass(exp, t);
			}

			case 'b':
			case 'B':
				if (!isclass) {
					int node = trex_newnode(exp, OP_WB);
					exp->_nodes[node].left = *exp->_p;
					exp->_p++;
					return node;
				} //else default

			default:
				t = *exp->_p;
				exp->_p++;
				return trex_newnode(exp, t);
		}
	} else if (!scisprint(*exp->_p)) {

		trex_error(exp, _SC("letter expected"));
	}

	t = *exp->_p;
	exp->_p++;
	return trex_newnode(exp, t);
}